

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_ds.h
# Opt level: O1

void stbds_hmfree_func(void *a,size_t elemsize)

{
  ulong *__ptr;
  long lVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  ulong uVar4;
  
  if (a == (void *)0x0) {
    return;
  }
  __ptr = (ulong *)((long)a + -0x20);
  if (*(long *)((long)a + -0x10) != 0) {
    if ((*(char *)(*(long *)((long)a + -0x10) + 0x59) == '\x02') && (1 < *__ptr)) {
      puVar3 = (undefined8 *)((long)a + elemsize);
      uVar4 = 1;
      do {
        free((void *)*puVar3);
        uVar4 = uVar4 + 1;
        puVar3 = (undefined8 *)((long)puVar3 + elemsize);
      } while (uVar4 < *__ptr);
    }
    lVar1 = *(long *)((long)a + -0x10);
    puVar3 = *(undefined8 **)(lVar1 + 0x48);
    while (puVar3 != (undefined8 *)0x0) {
      puVar2 = (undefined8 *)*puVar3;
      free(puVar3);
      puVar3 = puVar2;
    }
    *(undefined8 *)(lVar1 + 0x48) = 0;
    *(undefined8 *)(lVar1 + 0x50) = 0;
    *(undefined8 *)(lVar1 + 0x58) = 0;
  }
  free(*(void **)((long)a + -0x10));
  free(__ptr);
  return;
}

Assistant:

void stbds_hmfree_func(void *a, size_t elemsize)
{
  if (a == NULL) return;
  if (stbds_hash_table(a) != NULL) {
    if (stbds_hash_table(a)->string.mode == STBDS_SH_STRDUP) {
      size_t i;
      // skip 0th element, which is default
      for (i=1; i < stbds_header(a)->length; ++i)
        STBDS_FREE(NULL, *(char**) ((char *) a + elemsize*i));
    }
    stbds_strreset(&stbds_hash_table(a)->string);
  }
  STBDS_FREE(NULL, stbds_header(a)->hash_table);
  STBDS_FREE(NULL, stbds_header(a));
}